

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O1

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  string *input;
  cmMakefile *pcVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  PolicyStatus PVar9;
  undefined8 uVar10;
  long lVar11;
  ostream *poVar12;
  cmTarget *pcVar13;
  PolicyID id;
  MessageType t;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  string local_1d8;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)input) < 0x21) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    __first._M_current = input + 1;
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      bVar7 = false;
      local_1b0 = 0;
      bVar6 = false;
      local_1b8 = 0;
      local_1b4 = 0;
      local_1ac = 0;
    }
    else {
      local_1ac = 0;
      local_1b4 = 0;
      local_1b8 = 0;
      bVar6 = false;
      local_1b0 = 0;
      bVar7 = false;
      do {
        uVar10 = std::__cxx11::string::compare((char *)__first._M_current);
        bVar5 = bVar6;
        if ((int)uVar10 == 0) {
          local_1ac = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
        }
        else {
          uVar10 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar10 == 0) {
            local_1b4 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
          }
          else {
            uVar10 = std::__cxx11::string::compare((char *)__first._M_current);
            if ((int)uVar10 == 0) {
              local_1b8 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)__first._M_current);
              if (iVar8 == 0) {
                bVar7 = true;
              }
              else if ((bVar7) &&
                      (uVar10 = std::__cxx11::string::compare((char *)__first._M_current),
                      (int)uVar10 == 0)) {
                local_1b0 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)__first._M_current);
                bVar5 = true;
                if (iVar8 != 0) break;
              }
            }
          }
        }
        bVar6 = bVar5;
        __first._M_current = __first._M_current + 1;
      } while (__first._M_current !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar5 = cmGeneratorExpression::IsValidTargetName(input);
    if (bVar5) {
      bVar5 = cmGlobalGenerator::IsReservedTarget(input);
      bVar5 = !bVar5;
    }
    else {
      bVar5 = false;
    }
    if ((!bVar7 && !bVar6) && bVar5 == true) {
      lVar11 = std::__cxx11::string::find((char)input,0x3a);
      bVar5 = lVar11 == -1;
    }
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
      if (PVar9 - NEW < 3) {
        t = FATAL_ERROR;
        bVar4 = true;
        bVar5 = true;
      }
      else {
        bVar4 = false;
        t = AUTHOR_WARNING;
        bVar5 = false;
        if (PVar9 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x25,id);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,
                               local_1d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          bVar5 = true;
          bVar4 = false;
          t = AUTHOR_WARNING;
        }
      }
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The target name \"",0x11);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                   ,0x7b);
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,t,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) goto LAB_003b8bb6;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (bVar7) {
      if ((local_1ac & 1) == 0) {
        if ((local_1b4 & 1) == 0) {
          if ((local_1b8 & 1) == 0) goto LAB_003b8ab3;
          if ((local_1b4 & 1) == 0) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,
                       "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
            goto LAB_003b86f2;
          }
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"may not be given MACOSX_BUNDLE for an IMPORTED target.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"may not be given WIN32 for an IMPORTED target.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      }
    }
    else {
LAB_003b8ab3:
      if (bVar6) {
        bVar6 = cmGeneratorExpression::IsValidTargetName(input);
        if (!bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"Invalid name for ALIAS: ",input);
          cmCommand::SetError(&this->super_cmCommand,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8);
          if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
            return false;
          }
          goto LAB_003b86fc;
        }
        if ((local_1b8 & 1) == 0) {
          if (!bVar7 && (local_1b0 & 1) == 0) {
            if ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start == 0x60) {
              pcVar3 = ((__first._M_current)->_M_dataplus)._M_p;
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string((string *)local_1a8,pcVar3,(allocator *)&local_1d8);
              bVar7 = cmMakefile::IsAlias(pcVar2,(string *)local_1a8);
              pcVar1 = local_1a8 + 0x10;
              if ((pointer)local_1a8._0_8_ != pcVar1) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
              }
              if (bVar7) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(input->_M_dataplus)._M_p,
                                     input->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" because target \"",0x12);
                poVar12 = std::operator<<(poVar12,pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is itself an ALIAS.",0x15);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1d8);
              }
              else {
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string((string *)local_1a8,pcVar3,(allocator *)&local_1d8);
                pcVar13 = cmMakefile::FindTargetToUse(pcVar2,(string *)local_1a8,true);
                if ((pointer)local_1a8._0_8_ != pcVar1) {
                  operator_delete((void *)local_1a8._0_8_,
                                  CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
                }
                if (pcVar13 == (cmTarget *)0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,
                                       input->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::operator<<(poVar12,pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" does not already exist.",0x19);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1d8);
                }
                else if (pcVar13->TargetTypeValue == EXECUTABLE) {
                  if (pcVar13->IsImportedTarget != true) {
                    pcVar2 = (this->super_cmCommand).Makefile;
                    std::__cxx11::string::string((string *)local_1a8,pcVar3,(allocator *)&local_1d8)
                    ;
                    cmMakefile::AddAlias(pcVar2,input,(string *)local_1a8);
                    if ((pointer)local_1a8._0_8_ == pcVar1) {
                      return true;
                    }
                    operator_delete((void *)local_1a8._0_8_,
                                    CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
                    return true;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,
                                       input->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::operator<<(poVar12,pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" is IMPORTED.",0xe);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1d8);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,
                                       input->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::operator<<(poVar12,pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" is not an executable.",0x17);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1d8);
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ALIAS requires exactly one target argument.",0x2b);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_1d8);
            }
            goto LAB_003b8b9b;
          }
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"IMPORTED with ALIAS is not allowed.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
        else {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
      }
      else {
        if (bVar7) {
          pcVar13 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,input,false);
          if (pcVar13 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget
                      ((this->super_cmCommand).Makefile,input,EXECUTABLE,(bool)((byte)local_1b0 & 1)
                      );
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"cannot create imported target \"",0x1f);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(input->_M_dataplus)._M_p,
                               input->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\" because another target with the same name already exists.",0x3b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1d8);
LAB_003b8b9b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
LAB_003b8bb6:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
        pcVar1 = local_1a8 + 0x10;
        local_1a8._8_8_ = 0;
        local_1a8[0x10] = '\0';
        local_1a8._0_8_ = pcVar1;
        bVar7 = cmMakefile::EnforceUniqueName
                          ((this->super_cmCommand).Makefile,input,(string *)local_1a8,false);
        if (bVar7) {
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          if (!bVar7) {
            return false;
          }
        }
        __last._M_current =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8
                     ,__first,__last,(allocator_type *)local_1a8);
          pcVar13 = cmMakefile::AddExecutable
                              ((this->super_cmCommand).Makefile,(input->_M_dataplus)._M_p,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_1d8,(bool)((byte)local_1b8 & 1));
          if ((local_1ac & 1) != 0) {
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"WIN32_EXECUTABLE","");
            cmTarget::SetProperty(pcVar13,(string *)local_1a8,"ON");
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
          }
          if ((local_1b4 & 1) != 0) {
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"MACOSX_BUNDLE","");
            cmTarget::SetProperty(pcVar13,(string *)local_1a8,"ON");
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1d8);
          return true;
        }
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "called with incorrect number of arguments, no sources provided","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      }
    }
  }
LAB_003b86f2:
  if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
    return false;
  }
LAB_003b86fc:
  operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  return false;
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      /* clang-format off */
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      /* clang-format on */
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an "
                          "executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  if (s == args.end()) {
    this->SetError(
      "called with incorrect number of arguments, no sources provided");
    return false;
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename.c_str(), srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}